

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapES5ArrayInfo
               (SnapObject *snpObject,RecyclableObject *obj,InflateMap *inflator)

{
  uint *puVar1;
  long lVar2;
  TTDVar pvVar3;
  Var pvVar4;
  Var pvVar5;
  long lVar6;
  ulong uVar7;
  
  if (snpObject->SnapObjectTag == SnapES5ArrayObject) {
    puVar1 = (uint *)snpObject->AddtlSnapObjectInfo;
    DoAddtlValueInstantiation_SnapArrayInfoCore<void*,void*>
              (*(SnapArrayInfo<void_*> **)(puVar1 + 4),(JavascriptArray *)obj,inflator);
    if (*puVar1 != 0) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        lVar2 = *(long *)(puVar1 + 2);
        pvVar3 = *(TTDVar *)(lVar2 + 8 + lVar6);
        if (pvVar3 == (TTDVar)0x0) {
          pvVar4 = (Var)0x0;
        }
        else {
          pvVar4 = InflateMap::InflateTTDVar(inflator,pvVar3);
        }
        pvVar3 = *(TTDVar *)(lVar2 + 0x10 + lVar6);
        if (pvVar3 == (TTDVar)0x0) {
          pvVar5 = (Var)0x0;
        }
        else {
          pvVar5 = InflateMap::InflateTTDVar(inflator,pvVar3);
        }
        if (pvVar4 != (Var)0x0 || pvVar5 != (Var)0x0) {
          (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [0x6d])(obj,(ulong)*(uint *)(lVar2 + lVar6),pvVar4,pvVar5);
        }
        (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
          [0x6c])(obj,(ulong)*(uint *)(lVar2 + lVar6),(ulong)*(byte *)(lVar2 + 4 + lVar6));
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x18;
      } while (uVar7 < *puVar1);
    }
    Js::JavascriptLibrary::SetLengthWritableES5Array_TTD(obj,SUB41(puVar1[6],0));
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void DoAddtlValueInstantiation_SnapES5ArrayInfo(const SnapObject* snpObject, Js::RecyclableObject* obj, InflateMap* inflator)
        {
            SnapES5ArrayInfo* es5Info = SnapObjectGetAddtlInfoAs<SnapES5ArrayInfo*, SnapObjectType::SnapES5ArrayObject>(snpObject);

            Js::JavascriptArray* arrayObj = static_cast<Js::JavascriptArray*>(obj);
            DoAddtlValueInstantiation_SnapArrayInfoCore<TTDVar, Js::Var>(es5Info->BasicArrayData, arrayObj, inflator);

            for(uint32 i = 0; i < es5Info->GetterSetterCount; ++i)
            {
                const SnapES5ArrayGetterSetterEntry* entry = es5Info->GetterSetterEntries + i;

                Js::Var getter = nullptr;
                if(entry->Getter != nullptr)
                {
                    getter = inflator->InflateTTDVar(entry->Getter);
                }

                Js::Var setter = nullptr;
                if(entry->Setter != nullptr)
                {
                    setter = inflator->InflateTTDVar(entry->Setter);
                }

                if(getter != nullptr || setter != nullptr)
                {
                    arrayObj->SetItemAccessors(entry->Index, getter, setter);
                }

                arrayObj->SetItemAttributes(entry->Index, entry->Attributes);
            }

            //do length writable as needed
            Js::JavascriptLibrary::SetLengthWritableES5Array_TTD(arrayObj, es5Info->IsLengthWritable);
        }